

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  char *__s;
  string local_30;
  
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(&local_30,this,type,false);
    ConvertCase(__return_storage_ptr__,&local_30,kUpperCamel,kSnake);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    if (type->base_type == BASE_TYPE_STRUCT) {
      __s = "Offset";
      if (type->struct_def->fixed != false) {
        __s = "Struct";
      }
    }
    else {
      __s = "Offset";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const Type &type) const {
    return IsScalar(type.base_type)
               ? ConvertCase(GenTypeBasic(type, false), Case::kUpperCamel)
               : (IsStruct(type) ? "Struct" : "Offset");
  }